

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_4::DecorationTakesIdParameters(Decoration type)

{
  bool local_9;
  Decoration type_local;
  
  if (((type == DecorationUniformId) || (type - AlignmentId < 2)) || (type == CounterBuffer)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool DecorationTakesIdParameters(spv::Decoration type) {
  switch (type) {
    case spv::Decoration::UniformId:
    case spv::Decoration::AlignmentId:
    case spv::Decoration::MaxByteOffsetId:
    case spv::Decoration::HlslCounterBufferGOOGLE:
      return true;
    default:
      break;
  }
  return false;
}